

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_generated_dispatch.c
# Opt level: O0

PFNGLENABLEVERTEXATTRIBARRAYARBPROC epoxy_glEnableVertexAttribArrayARB_resolver(void)

{
  PFNGLENABLEVERTEXATTRIBARRAYARBPROC p_Var1;
  
  p_Var1 = (PFNGLENABLEVERTEXATTRIBARRAYARBPROC)
           gl_provider_resolver
                     ("glEnableVertexAttribArrayARB",
                      epoxy_glEnableVertexAttribArrayARB_resolver::providers,
                      epoxy_glEnableVertexAttribArrayARB_resolver::entrypoints);
  return p_Var1;
}

Assistant:

static PFNGLENABLEVERTEXATTRIBARRAYARBPROC
epoxy_glEnableVertexAttribArrayARB_resolver(void)
{
    static const enum gl_provider providers[] = {
        GL_extension_GL_ARB_vertex_program,
        GL_extension_GL_ARB_vertex_shader,
        Desktop_OpenGL_2_0,
        OpenGL_ES_2_0,
        gl_provider_terminator
    };
    static const uint32_t entrypoints[] = {
        12608 /* "glEnableVertexAttribArrayARB" */,
        12608 /* "glEnableVertexAttribArrayARB" */,
        12582 /* "glEnableVertexAttribArray" */,
        12582 /* "glEnableVertexAttribArray" */,
    };
    return gl_provider_resolver(entrypoint_strings + 12608 /* "glEnableVertexAttribArrayARB" */,
                                providers, entrypoints);
}